

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-stop.c
# Opt level: O3

int run_test_loop_stop(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  uv_timer_t *puVar3;
  long lVar4;
  long lVar5;
  undefined1 auStack_d0 [152];
  code *pcStack_38;
  uv_timer_t *puStack_30;
  
  uVar2 = uv_default_loop();
  uv_prepare_init(uVar2,&prepare_handle);
  uv_prepare_start(&prepare_handle,prepare_cb);
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100,100);
  puVar3 = (uv_timer_t *)uv_default_loop();
  iVar1 = uv_run(puVar3,0);
  if (iVar1 == 0) {
    run_test_loop_stop_cold_7();
LAB_00163d48:
    run_test_loop_stop_cold_1();
LAB_00163d4d:
    run_test_loop_stop_cold_6();
LAB_00163d52:
    run_test_loop_stop_cold_2();
LAB_00163d57:
    run_test_loop_stop_cold_3();
LAB_00163d5c:
    run_test_loop_stop_cold_4();
  }
  else {
    if (timer_called != 1) goto LAB_00163d48;
    puVar3 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_run(puVar3,2);
    if (iVar1 == 0) goto LAB_00163d4d;
    if (prepare_called < 2) goto LAB_00163d52;
    puVar3 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_run(puVar3,0);
    if (iVar1 != 0) goto LAB_00163d57;
    if (timer_called != 10) goto LAB_00163d5c;
    if (prepare_called == 10) {
      return 0;
    }
  }
  run_test_loop_stop_cold_5();
  if (puVar3 == (uv_timer_t *)&prepare_handle) {
    prepare_called = prepare_called + 1;
    if (prepare_called == 10) {
      iVar1 = uv_prepare_stop(&prepare_handle);
      return iVar1;
    }
    return prepare_called;
  }
  prepare_cb_cold_1();
  iVar1 = timer_called;
  if (puVar3 == &timer_handle) {
    timer_called = timer_called + 1;
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_stop(uVar2);
      return iVar1;
    }
    if (timer_called == 10) {
      iVar1 = uv_timer_stop(&timer_handle);
      return iVar1;
    }
    return extraout_EAX;
  }
  timer_cb_cold_1();
  puStack_30 = &timer_handle;
  pcStack_38 = (code *)0x163dea;
  uVar2 = uv_default_loop();
  pcStack_38 = (code *)0x163df2;
  lVar4 = uv_now(uVar2);
  do {
    pcStack_38 = (code *)0x163dfa;
    uVar2 = uv_default_loop();
    pcStack_38 = (code *)0x163e02;
    lVar5 = uv_now(uVar2);
    pcStack_38 = (code *)0x163e0d;
    uVar2 = uv_default_loop();
    if (999 < (ulong)(lVar5 - lVar4)) goto LAB_00163e2f;
    pcStack_38 = (code *)0x163e26;
    iVar1 = uv_run(uVar2,2);
  } while (iVar1 == 0);
  pcStack_38 = (code *)0x163e2f;
  run_test_loop_update_time_cold_2();
LAB_00163e2f:
  pcStack_38 = (code *)0x163e40;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_38 = (code *)0x163e4a;
  uv_run(uVar2,0);
  pcStack_38 = (code *)0x163e4f;
  uVar2 = uv_default_loop();
  pcStack_38 = (code *)0x163e57;
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_38 = run_test_loop_backend_timeout;
  run_test_loop_update_time_cold_1();
  pcStack_38 = (code *)lVar4;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_d0);
  if (iVar1 == 0) {
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 != 0) goto LAB_00163f47;
    iVar1 = uv_backend_timeout(uVar2);
    if (iVar1 != 0) goto LAB_00163f4c;
    iVar1 = uv_timer_start(auStack_d0,cb,1000,0);
    if (iVar1 != 0) goto LAB_00163f51;
    iVar1 = uv_backend_timeout(uVar2);
    if (iVar1 < 0x65) goto LAB_00163f56;
    iVar1 = uv_backend_timeout(uVar2);
    if (1000 < iVar1) goto LAB_00163f5b;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_00163f60;
    iVar1 = uv_backend_timeout(uVar2);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163f6a;
    }
  }
  else {
    run_test_loop_backend_timeout_cold_1();
LAB_00163f47:
    run_test_loop_backend_timeout_cold_2();
LAB_00163f4c:
    run_test_loop_backend_timeout_cold_3();
LAB_00163f51:
    run_test_loop_backend_timeout_cold_4();
LAB_00163f56:
    run_test_loop_backend_timeout_cold_5();
LAB_00163f5b:
    run_test_loop_backend_timeout_cold_6();
LAB_00163f60:
    run_test_loop_backend_timeout_cold_7();
  }
  run_test_loop_backend_timeout_cold_8();
LAB_00163f6a:
  run_test_loop_backend_timeout_cold_9();
  iVar1 = uv_close();
  return iVar1;
}

Assistant:

TEST_IMPL(loop_stop) {
  int r;
  uv_prepare_init(uv_default_loop(), &prepare_handle);
  uv_prepare_start(&prepare_handle, prepare_cb);
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r != 0);
  ASSERT(timer_called == 1);

  r = uv_run(uv_default_loop(), UV_RUN_NOWAIT);
  ASSERT(r != 0);
  ASSERT(prepare_called > 1);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(timer_called == 10);
  ASSERT(prepare_called == 10);

  return 0;
}